

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O2

void fire_damageu(int n,monst *mtmp,char *k_name,int k_format,int destroy,boolean fire,
                 boolean hurt_maxhp)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (u.uprops[0x37].intrinsic != 0) {
    n = 0;
    pline("You are unharmed!");
    goto LAB_001ca24c;
  }
  uVar3 = CONCAT71((int7)((ulong)mtmp >> 8),hurt_maxhp);
  iVar1 = 2;
  if ((fire != '\0') && (u.umonnum != u.umonster)) {
    switch(u.umonnum) {
    case 0xff:
      pcVar4 = (char *)((long)u.mhmax % 2 & 0xffffffff);
      goto LAB_001ca127;
    case 0x100:
      pcVar4 = k_name;
      iVar1 = u.mhmax;
      goto LAB_001ca129;
    default:
      goto switchD_001ca0f7_caseD_101;
    case 0x104:
      iVar1 = 8;
      break;
    case 0x105:
      iVar1 = 4;
    }
    pcVar4 = (char *)(ulong)(uint)(u.mhmax % iVar1);
LAB_001ca127:
    iVar1 = u.mhmax / iVar1;
LAB_001ca129:
    if (iVar1 != 0) {
      pline("You roast!",uVar3,pcVar4);
      uVar3 = (ulong)(byte)hurt_maxhp;
      if (n < iVar1) {
        n = iVar1;
      }
    }
  }
switchD_001ca0f7_caseD_101:
  if ((u.uprops[1].extrinsic == 0 && u.uprops[1].intrinsic == 0) &&
     (((byte)youmonst.mintrinsics & 1) == 0)) {
    if ((char)uVar3 != '\0') {
      if (u.umonnum == u.umonster) {
        if (u.uhpmax <= u.ulevel) goto LAB_001ca24c;
        iVar1 = n + 1;
        if (u.uhpmax < n + 1) {
          iVar1 = u.uhpmax;
        }
        iVar1 = rn2(iVar1);
        u.uhpmax = u.uhpmax - iVar1;
        if (u.uhpmax < u.uhp) {
          u.uhp = u.uhpmax;
        }
      }
      else {
        if (u.mhmax <= mons[u.umonnum].mlevel) goto LAB_001ca24c;
        iVar1 = n + 1;
        if (u.mhmax < n + 1) {
          iVar1 = u.mhmax;
        }
        iVar1 = rn2(iVar1);
        u.mhmax = u.mhmax - iVar1;
        if (u.mhmax < u.mh) {
          u.mh = u.mhmax;
        }
      }
      iflags.botl = '\x01';
    }
  }
  else {
    shieldeff(u.ux,u.uy);
    if (u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) {
      if (((byte)youmonst.mintrinsics & 1) == 0) goto LAB_001ca24c;
    }
    else if ((((u.uprops[1].intrinsic >> 0x1a & 1) != 0) &&
             ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) &&
            (((byte)youmonst.mintrinsics & 1) == 0)) {
      n = (n + 1) / 2;
      goto LAB_001ca24c;
    }
    pcVar4 = "The fire doesn\'t feel hot!";
    if (fire == '\0') {
      pcVar4 = "You feel mildly hot.";
    }
    pline(pcVar4);
    ugolemeffects(2,n);
    n = 0;
  }
LAB_001ca24c:
  burn_away_slime();
  uVar2 = mt_random();
  if ((int)(uVar2 % 0x14) < destroy) {
    destroy_item(9,2);
  }
  uVar2 = mt_random();
  if ((int)(uVar2 % 0x14) < destroy) {
    destroy_item(8,2);
  }
  uVar2 = mt_random();
  if ((int)(uVar2 % 0x19) < destroy) {
    destroy_item(10,2);
  }
  uVar2 = mt_random();
  if ((int)(uVar2 % 0x14) < destroy) {
    burnarmor(&youmonst);
  }
  if (n != 0) {
    if (mtmp != (monst *)0x0) {
      mdamageu(mtmp,n);
      return;
    }
    losehp(n,k_name,k_format);
    return;
  }
  return;
}

Assistant:

void fire_damageu(int n, struct monst *mtmp, const char *k_name, int k_format,
		  int destroy, boolean fire, boolean hurt_maxhp)
{
	if (Invulnerable) {
	    pline("You are unharmed!");
	    n = 0;
	} else {
	    /* certain golems take a lot of damage from the heat */
	    if (fire && Upolyd) {
		int alt;
		switch (u.umonnum) {
		case PM_PAPER_GOLEM:	alt = u.mhmax; break;
		case PM_STRAW_GOLEM:	alt = u.mhmax / 2; break;
		case PM_WOOD_GOLEM:	alt = u.mhmax / 4; break;
		case PM_LEATHER_GOLEM:	alt = u.mhmax / 8; break;
		default:		alt = 0; break;
		}
		if (alt) {
		    pline("You roast!");
		    if (alt > n) n = alt;
		}
	    }

	    if (Fire_resistance) {
		shieldeff(u.ux, u.uy);
		if (FFire_resistance) {
		    if (fire)
			pline("The fire doesn't feel hot!");
		    else
			pline("You feel mildly hot.");
		    ugolemeffects(AD_FIRE, n);
		    n = 0;
		} else if (PFire_resistance) {
		    n = (n + 1) / 2;
		}
	    } else if (hurt_maxhp) {
		if (Upolyd) {
		    if (u.mhmax > mons[u.umonnum].mlevel) {
			u.mhmax -= rn2(min(u.mhmax, n + 1));
			if (u.mh > u.mhmax) u.mh = u.mhmax;
			iflags.botl = 1;
		    }
		} else if (u.uhpmax > u.ulevel) {
		    u.uhpmax -= rn2(min(u.uhpmax, n + 1));
		    if (u.uhp > u.uhpmax) u.uhp = u.uhpmax;
		    iflags.botl = 1;
		}
	    }
	}

	burn_away_slime();
	if (destroy > rn2(20)) destroy_item(SCROLL_CLASS, AD_FIRE);
	if (destroy > rn2(20)) destroy_item(POTION_CLASS, AD_FIRE);
	if (destroy > rn2(25)) destroy_item(SPBOOK_CLASS, AD_FIRE);
	if (destroy > rn2(20)) burnarmor(&youmonst);

	if (n) {
	    if (mtmp)
		mdamageu(mtmp, n);
	    else
		losehp(n, k_name, k_format);
	}
}